

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall
Search::predictor::make_new_pointer<float>(predictor *this,v_array<float> *A,size_t new_size)

{
  float *__src;
  size_t sVar1;
  float **ppfVar2;
  float *pfVar3;
  long in_RDX;
  v_array<float> *in_RSI;
  float *old_pointer;
  size_t old_size;
  size_t in_stack_00000198;
  
  sVar1 = v_array<float>::size(in_RSI);
  ppfVar2 = v_array<float>::begin(in_RSI);
  __src = *ppfVar2;
  pfVar3 = calloc_or_throw<float>(in_stack_00000198);
  ppfVar2 = v_array<float>::begin(in_RSI);
  *ppfVar2 = pfVar3;
  ppfVar2 = v_array<float>::begin(in_RSI);
  pfVar3 = *ppfVar2;
  ppfVar2 = v_array<float>::end(in_RSI);
  *ppfVar2 = pfVar3 + in_RDX;
  ppfVar2 = v_array<float>::end(in_RSI);
  in_RSI->end_array = *ppfVar2;
  ppfVar2 = v_array<float>::begin(in_RSI);
  memcpy(*ppfVar2,__src,sVar1 << 2);
  return;
}

Assistant:

void predictor::make_new_pointer(v_array<T>& A, size_t new_size)
{
  size_t old_size = A.size();
  T* old_pointer = A.begin();
  A.begin() = calloc_or_throw<T>(new_size);
  A.end() = A.begin() + new_size;
  A.end_array = A.end();
  memcpy(A.begin(), old_pointer, old_size * sizeof(T));
}